

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

void __thiscall
gtl::
dense_hashtable<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>::Identity,_gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>::SetKey,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>
::clear_to_size(dense_hashtable<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>::Identity,_gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>::SetKey,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>
                *this,size_type new_num_buckets)

{
  ShapeEdgeId *pSVar1;
  int32 iVar2;
  ShapeEdgeId *pSVar3;
  ulong uVar4;
  float fVar5;
  
  pSVar3 = this->table;
  if (pSVar3 != (ShapeEdgeId *)0x0) {
    if (this->num_buckets == new_num_buckets) goto LAB_001b1c4e;
    operator_delete(pSVar3);
  }
  pSVar3 = __gnu_cxx::new_allocator<s2shapeutil::ShapeEdgeId>::allocate
                     ((new_allocator<s2shapeutil::ShapeEdgeId> *)&this->key_info,new_num_buckets,
                      (void *)0x0);
  this->table = pSVar3;
  if (pSVar3 == (ShapeEdgeId *)0x0) {
    __assert_fail("table",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/densehashtable.h"
                  ,0x3cd,
                  "void gtl::dense_hashtable<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash, gtl::dense_hash_set<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash>::Identity, gtl::dense_hash_set<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash>::SetKey, std::equal_to<s2shapeutil::ShapeEdgeId>, std::allocator<s2shapeutil::ShapeEdgeId>>::clear_to_size(size_type) [Value = s2shapeutil::ShapeEdgeId, Key = s2shapeutil::ShapeEdgeId, HashFcn = s2shapeutil::ShapeEdgeIdHash, ExtractKey = gtl::dense_hash_set<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash>::Identity, SetKey = gtl::dense_hash_set<s2shapeutil::ShapeEdgeId, s2shapeutil::ShapeEdgeIdHash>::SetKey, EqualKey = std::equal_to<s2shapeutil::ShapeEdgeId>, Alloc = std::allocator<s2shapeutil::ShapeEdgeId>]"
                 );
  }
LAB_001b1c4e:
  if (new_num_buckets != 0) {
    pSVar1 = pSVar3 + new_num_buckets;
    do {
      pSVar3->shape_id = -1;
      pSVar3->edge_id = -1;
      iVar2 = (this->key_info).empty.edge_id;
      pSVar3->shape_id = (this->key_info).empty.shape_id;
      pSVar3->edge_id = iVar2;
      pSVar3 = pSVar3 + 1;
    } while (pSVar3 != pSVar1);
  }
  this->num_deleted = 0;
  this->num_elements = 0;
  this->num_buckets = new_num_buckets;
  fVar5 = (this->settings).
          super_sh_hashtable_settings<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_unsigned_long,_4>
          .enlarge_factor_ * (float)new_num_buckets;
  uVar4 = (ulong)fVar5;
  uVar4 = (long)(fVar5 - 9.223372e+18) & (long)uVar4 >> 0x3f | uVar4;
  if (new_num_buckets - 1 < uVar4) {
    uVar4 = new_num_buckets - 1;
  }
  (this->settings).
  super_sh_hashtable_settings<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_unsigned_long,_4>
  .enlarge_threshold_ = uVar4;
  fVar5 = (float)new_num_buckets *
          (this->settings).
          super_sh_hashtable_settings<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_unsigned_long,_4>
          .shrink_factor_;
  uVar4 = (ulong)fVar5;
  (this->settings).
  super_sh_hashtable_settings<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_unsigned_long,_4>
  .shrink_threshold_ = (long)(fVar5 - 9.223372e+18) & (long)uVar4 >> 0x3f | uVar4;
  (this->settings).
  super_sh_hashtable_settings<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_unsigned_long,_4>
  .consider_shrink_ = false;
  return;
}

Assistant:

void clear_to_size(size_type new_num_buckets) {
    if (!table) {
      table = get_internal_allocator().allocate(new_num_buckets);
    } else {
      destroy_buckets(0, num_buckets);
      if (new_num_buckets != num_buckets) {   // resize, if necessary
        resize_table(num_buckets, new_num_buckets);
      }
    }
    assert(table);
    fill_range_with_empty(table, table + new_num_buckets);
    num_elements = 0;
    num_deleted = 0;
    num_buckets = new_num_buckets;          // our new size
    settings.reset_thresholds(bucket_count());
  }